

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::SparseTextureAllocationTestCase::iterate(SparseTextureAllocationTestCase *this)

{
  ostringstream *poVar1;
  Functions *pFVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  int *piVar6;
  int *piVar7;
  char *description;
  int *piVar8;
  int *piVar9;
  qpTestResult testResult;
  TestContext *this_00;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  Functions *local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar3) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_1b8 = (Functions *)CONCAT44(extraout_var,iVar4);
    piVar8 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar8 != piVar6) {
      piVar7 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        piVar9 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (piVar9 != piVar7) {
          do {
            local_1b0._0_8_ = local_1a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1aee929);
            std::__cxx11::stringbuf::str((string *)&this->field_0x90);
            if ((TestLog *)local_1b0._0_8_ != local_1a0) {
              operator_delete((void *)local_1b0._0_8_,
                              (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&this->field_0x88,"Testing sparse texture allocation for target: "
                       ,0x2e);
            poVar5 = (ostream *)std::ostream::operator<<(&this->field_0x88,*piVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
            pFVar2 = local_1b8;
            bVar3 = positiveTesting(this,local_1b8,*piVar8,*piVar9);
            if (!bVar3) {
LAB_00a52c43:
              local_1b0._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)local_1d8,local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Fail",4);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00a52d01;
            }
            bVar3 = verifyTexParameterErrors(this,pFVar2,*piVar8,*piVar9);
            if (!bVar3) goto LAB_00a52c43;
            bVar3 = verifyTexStorageVirtualPageSizeIndexError(this,pFVar2,*piVar8,*piVar9);
            if (!bVar3) goto LAB_00a52c43;
            bVar3 = verifyTexStorageFullArrayCubeMipmapsError(this,pFVar2,*piVar8,*piVar9);
            if (!bVar3) goto LAB_00a52c43;
            bVar3 = verifyTexStorageInvalidValueErrors(this,pFVar2,*piVar8,*piVar9);
            if (!bVar3) goto LAB_00a52c43;
            piVar7 = piVar9 + 1;
            piVar9 = piVar7;
          } while (piVar7 != (this->mSupportedInternalFormats).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
          piVar6 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 != piVar6);
    }
    piVar8 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar8 != piVar6) {
      piVar7 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        piVar9 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (piVar9 != piVar7) {
          do {
            local_1b0._0_8_ = local_1a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1aee929);
            std::__cxx11::stringbuf::str((string *)&this->field_0x90);
            if ((TestLog *)local_1b0._0_8_ != local_1a0) {
              operator_delete((void *)local_1b0._0_8_,
                              (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&this->field_0x88,
                       "Testing sparse texture allocation for target [full array]: ",0x3b);
            poVar5 = (ostream *)std::ostream::operator<<(&this->field_0x88,*piVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
            pFVar2 = local_1b8;
            bVar3 = verifyTexStorageFullArrayCubeMipmapsError(this,local_1b8,*piVar8,*piVar9);
            if (!bVar3) {
LAB_00a52ca3:
              local_1b0._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)local_1d8,local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Fail",4);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a52d01:
              if (local_1d8 != local_1c8) {
                operator_delete(local_1d8,local_1c8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
              std::ios_base::~ios_base(local_138);
              this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
              description = "Fail";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_00a52d48;
            }
            bVar3 = verifyTexStorageInvalidValueErrors(this,pFVar2,*piVar8,*piVar9);
            if (!bVar3) goto LAB_00a52ca3;
            piVar7 = piVar9 + 1;
            piVar9 = piVar7;
          } while (piVar7 != (this->mSupportedInternalFormats).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
          piVar6 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 != piVar6);
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00a52d48:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureAllocationTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing sparse texture allocation for target: " << target << ", format: " << format << " - ";

			result = positiveTesting(gl, target, format) && verifyTexParameterErrors(gl, target, format) &&
					 verifyTexStorageVirtualPageSizeIndexError(gl, target, format) &&
					 verifyTexStorageFullArrayCubeMipmapsError(gl, target, format) &&
					 verifyTexStorageInvalidValueErrors(gl, target, format);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	for (std::vector<glw::GLint>::const_iterator iter = mFullArrayTargets.begin(); iter != mFullArrayTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing sparse texture allocation for target [full array]: " << target << ", format: " << format
				 << " - ";

			result = verifyTexStorageFullArrayCubeMipmapsError(gl, target, format) &&
					 verifyTexStorageInvalidValueErrors(gl, target, format);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}